

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O2

void __thiscall CScriptID::CScriptID(CScriptID *this,CScript *in)

{
  long in_FS_OFFSET;
  uint160 local_2c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  Hash160<CScript>(&local_2c,in);
  *(undefined4 *)
   ((this->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems + 0x10) =
       local_2c.super_base_blob<160U>.m_data._M_elems._16_4_;
  *(undefined4 *)(this->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems =
       local_2c.super_base_blob<160U>.m_data._M_elems._0_4_;
  *(undefined4 *)((this->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems + 4)
       = local_2c.super_base_blob<160U>.m_data._M_elems._4_4_;
  *(undefined4 *)((this->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems + 8)
       = local_2c.super_base_blob<160U>.m_data._M_elems._8_4_;
  *(undefined4 *)
   ((this->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems + 0xc) =
       local_2c.super_base_blob<160U>.m_data._M_elems._12_4_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CScriptID::CScriptID(const CScript& in) : BaseHash(Hash160(in)) {}